

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

handle pybind11::detail::
       tuple_caster<std::tuple,unsigned_int,unsigned_int,bool,kratos::PortDirection,kratos::PortType>
       ::
       cast_impl<std::tuple<unsigned_int,unsigned_int,bool,kratos::PortDirection,kratos::PortType>const&,0ul,1ul,2ul,3ul,4ul>
                 (itype *src,return_value_policy policy,handle parent)

{
  long *plVar1;
  undefined8 uVar2;
  long lVar3;
  handle hVar4;
  undefined1 local_58 [8];
  array<pybind11::object,_5UL> entries;
  tuple result;
  
  local_58 = (undefined1  [8])PyLong_FromSize_t(src[4]);
  entries._M_elems[0].super_handle.m_ptr = (handle)PyLong_FromSize_t(src[3]);
  if ((char)src[2] == Data) {
    entries._M_elems[1].super_handle.m_ptr = (handle)&_Py_FalseStruct;
  }
  else {
    entries._M_elems[1].super_handle.m_ptr = (handle)&_Py_TrueStruct;
  }
  ((PyObject *)entries._M_elems[1].super_handle.m_ptr)->ob_refcnt =
       ((PyObject *)entries._M_elems[1].super_handle.m_ptr)->ob_refcnt + 1;
  entries._M_elems[2].super_handle =
       type_caster_base<kratos::PortDirection>::cast(src + 1,policy,parent);
  entries._M_elems[3].super_handle = type_caster_base<kratos::PortType>::cast(src,policy,parent);
  hVar4.m_ptr = (PyObject *)0x0;
  lVar3 = 0;
  while (lVar3 != 0x28) {
    plVar1 = (long *)((long)(entries._M_elems + -1) + lVar3);
    lVar3 = lVar3 + 8;
    if (*plVar1 == 0) goto LAB_003511ef;
  }
  tuple::tuple<unsigned_long,_0>((tuple *)(entries._M_elems + 4),5);
  for (lVar3 = 0; hVar4 = entries._M_elems[4].super_handle.m_ptr, lVar3 != 0x28; lVar3 = lVar3 + 8)
  {
    uVar2 = *(undefined8 *)((long)(entries._M_elems + -1) + lVar3);
    *(undefined8 *)((long)(entries._M_elems + -1) + lVar3) = 0;
    if ((*(byte *)(*(long *)((long)entries._M_elems[4].super_handle.m_ptr + 8) + 0xab) & 4) == 0) {
      __assert_fail("PyTuple_Check(result.ptr())",
                    "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/pybind11/include/pybind11/cast.h"
                    ,0x280,
                    "static handle pybind11::detail::tuple_caster<std::tuple, unsigned int, unsigned int, bool, kratos::PortDirection, kratos::PortType>::cast_impl(T &&, return_value_policy, handle, index_sequence<Is...>) [Tuple = std::tuple, Ts = <unsigned int, unsigned int, bool, kratos::PortDirection, kratos::PortType>, T = const std::tuple<unsigned int, unsigned int, bool, kratos::PortDirection, kratos::PortType> &, Is = <0UL, 1UL, 2UL, 3UL, 4UL>]"
                   );
    }
    *(undefined8 *)((long)entries._M_elems[4].super_handle.m_ptr + 0x18 + lVar3) = uVar2;
  }
  entries._M_elems[4].super_handle.m_ptr = (handle)(PyObject *)0x0;
  object::~object(entries._M_elems + 4);
LAB_003511ef:
  std::array<pybind11::object,_5UL>::~array((array<pybind11::object,_5UL> *)local_58);
  return (handle)hVar4.m_ptr;
}

Assistant:

static handle cast_impl(T &&src, return_value_policy policy, handle parent, index_sequence<Is...>) {
        PYBIND11_WORKAROUND_INCORRECT_MSVC_C4100(src, policy, parent);
        PYBIND11_WORKAROUND_INCORRECT_GCC_UNUSED_BUT_SET_PARAMETER(policy, parent);
        std::array<object, size> entries{{
            reinterpret_steal<object>(make_caster<Ts>::cast(std::get<Is>(std::forward<T>(src)), policy, parent))...
        }};
        for (const auto &entry: entries)
            if (!entry)
                return handle();
        tuple result(size);
        int counter = 0;
        for (auto & entry: entries)
            PyTuple_SET_ITEM(result.ptr(), counter++, entry.release().ptr());
        return result.release();
    }